

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

void __thiscall
nigel::IMC_Generator::parseCondition
          (IMC_Generator *this,shared_ptr<nigel::AstExpr> *ast,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          *varList)

{
  char cVar1;
  Type TVar2;
  Type TVar3;
  element_type *peVar4;
  shared_ptr<nigel::IM_Operator> rOp_00;
  shared_ptr<nigel::IM_Operator> rOp_01;
  shared_ptr<nigel::IM_Operator> rOp_02;
  shared_ptr<nigel::IM_Operator> rOp_03;
  shared_ptr<nigel::IM_Operator> rOp_04;
  shared_ptr<nigel::IM_Operator> rOp_05;
  shared_ptr<nigel::Token> token;
  shared_ptr<nigel::Token> token_00;
  shared_ptr<nigel::Token> token_01;
  shared_ptr<nigel::Token> token_02;
  shared_ptr<nigel::Token> token_03;
  shared_ptr<nigel::Token> token_04;
  shared_ptr<nigel::IM_Operator> *psVar5;
  shared_ptr<nigel::IM_Operator> *psVar6;
  int iVar7;
  __shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  OperationType unaff_EBP;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<nigel::IM_Command> conditionPos;
  undefined1 local_738 [16];
  shared_ptr<nigel::AstComparisonCondition> a;
  shared_ptr<nigel::IM_Operator> rOp;
  shared_ptr<nigel::AstExpr> local_708;
  shared_ptr<nigel::AstExpr> local_6f8;
  shared_ptr<nigel::AstExpr> local_6e8;
  shared_ptr<nigel::AstExpr> local_6d8;
  shared_ptr<nigel::AstExpr> local_6c8;
  shared_ptr<nigel::AstExpr> local_6b8;
  undefined1 local_6a8 [16];
  shared_ptr<nigel::AstExpr> local_698;
  undefined1 local_688 [16];
  shared_ptr<nigel::AstExpr> local_678;
  undefined1 local_668 [16];
  shared_ptr<nigel::AstExpr> local_658;
  shared_ptr<nigel::IM_Operator> local_648;
  shared_ptr<nigel::IM_Operator> local_638;
  shared_ptr<nigel::IM_Operator> local_628;
  shared_ptr<nigel::IM_Operator> local_618;
  shared_ptr<nigel::IM_Operator> local_608;
  shared_ptr<nigel::IM_Operator> local_5f8;
  shared_ptr<nigel::IM_Operator> local_5e8;
  shared_ptr<nigel::IM_Operator> local_5d8;
  shared_ptr<nigel::IM_Operator> local_5c8;
  shared_ptr<nigel::IM_Operator> local_5b8;
  shared_ptr<nigel::IM_Operator> local_5a8;
  shared_ptr<nigel::IM_Operator> local_598;
  shared_ptr<nigel::IM_Operator> local_588;
  shared_ptr<nigel::IM_Operator> local_578;
  shared_ptr<nigel::IM_Operator> local_568;
  shared_ptr<nigel::IM_Operator> local_558;
  shared_ptr<nigel::IM_Operator> local_548;
  shared_ptr<nigel::IM_Operator> local_538;
  shared_ptr<nigel::IM_Operator> local_528;
  shared_ptr<nigel::IM_Operator> local_518;
  shared_ptr<nigel::IM_Operator> local_508;
  shared_ptr<nigel::IM_Operator> local_4f8;
  shared_ptr<nigel::IM_Operator> local_4e8;
  shared_ptr<nigel::IM_Operator> local_4d8;
  shared_ptr<nigel::IM_Operator> local_4c8;
  shared_ptr<nigel::IM_Operator> local_4b8;
  shared_ptr<nigel::IM_Operator> local_4a8;
  shared_ptr<nigel::IM_Operator> local_498;
  shared_ptr<nigel::IM_Operator> local_488;
  shared_ptr<nigel::IM_Operator> local_478;
  shared_ptr<nigel::IM_Operator> local_468;
  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> local_458;
  undefined1 local_448 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_438 [32];
  undefined1 local_418 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  undefined1 local_408 [32];
  undefined1 local_3e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  undefined1 local_3a8 [32];
  undefined1 local_388 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_380;
  undefined1 local_378 [32];
  undefined1 local_358 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  undefined1 local_348 [32];
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_328;
  shared_ptr<nigel::IM_Operator> local_318;
  shared_ptr<nigel::IM_Operator> local_308;
  shared_ptr<nigel::IM_Operator> local_2f8;
  shared_ptr<nigel::IM_Operator> local_2e8;
  shared_ptr<nigel::IM_Operator> local_2d8;
  shared_ptr<nigel::IM_Operator> local_2c8;
  shared_ptr<nigel::IM_Operator> local_2b8;
  shared_ptr<nigel::IM_Operator> local_2a8;
  shared_ptr<nigel::IM_Operator> local_298;
  shared_ptr<nigel::IM_Operator> local_288;
  shared_ptr<nigel::IM_Operator> local_278;
  shared_ptr<nigel::IM_Operator> local_268;
  shared_ptr<nigel::IM_Operator> local_258;
  shared_ptr<nigel::IM_Operator> local_248;
  shared_ptr<nigel::IM_Operator> local_238;
  shared_ptr<nigel::IM_Operator> local_228;
  shared_ptr<nigel::IM_Operator> local_218;
  shared_ptr<nigel::IM_Operator> local_208;
  shared_ptr<nigel::IM_Operator> local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_150;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_60;
  
  peVar4 = (ast->super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  switch(peVar4->type) {
  case booleanParenthesis:
    AstExpr::as<nigel::AstBooleanParenthesis>((AstExpr *)&a);
    std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nigel::AstCondition,void>
              ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_658,
               (__shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2> *)
               &(a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->lVal);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
    ::_Rb_tree(&local_60,&varList->_M_t);
    parseCondition(this,&local_658,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                    *)&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
    ::~_Rb_tree(&local_60);
    p_Var9 = &local_658.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    goto LAB_0016cf4d;
  default:
    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_458,
               &(peVar4->token).super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,err_expectConditionInParanthesis,
               (shared_ptr<nigel::Token> *)&local_458);
    p_Var9 = &local_458._M_refcount;
    goto LAB_0016cf57;
  case keywordCondition:
    AstExpr::as<nigel::AstKeywordCondition>((AstExpr *)&a);
    cVar1 = *(char *)&((a.
                        super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->lVal).
                      super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (cVar1 != '\0') {
      return;
    }
    IM_Constant::fromConstant
              (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ._7_1_);
    p_Var9 = &a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,jmp_rel,&local_1f8,&local_468);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    goto LAB_0016cf57;
  case arithmenticCondition:
    AstExpr::as<nigel::AstArithmeticCondition>((AstExpr *)&conditionPos);
    std::__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)&a,
               (__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)
               (CONCAT44(conditionPos.
                         super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                         _4_4_,conditionPos.
                               super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._0_4_) + 0x30));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0;
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    TVar2 = ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->super_AstCondition).super_AstExpr.type;
    if (TVar2 < count) {
      if ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) == 0) {
        if (TVar2 == variable) {
          AstExpr::as<nigel::AstVariable>((AstExpr *)&rOp);
          p_Var8 = &std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                    ::operator[](varList,(key_type *)
                                         &rOp.
                                          super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr[1].type)->
                    super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                     p_Var8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          unaff_EBP = v;
        }
        else if (TVar2 == literal) {
          AstExpr::as<nigel::AstLiteral>((AstExpr *)local_668);
          IM_Constant::fromAstLiteral((shared_ptr<nigel::AstLiteral> *)&rOp);
          std::__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                     (__shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2> *)&rOp);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_668 + 8));
          unaff_EBP = c;
        }
      }
      else {
        std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<nigel::AstReturning,void>
                  ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_678,
                   (__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)&a);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::_Rb_tree(&local_90,&varList->_M_t);
        parseAst(this,&local_678,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                  *)&local_90);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::~_Rb_tree(&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_678.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        unaff_EBP = t;
      }
    }
    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_328,
               (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)&conditionPos);
    generateMoveA(this,unaff_EBP,(shared_ptr<nigel::IM_Operator> *)&local_328);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_328._M_refcount);
    IM_Constant::fromConstant
              (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ._7_1_);
    local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,jmp_z_rel,&local_208,&local_478);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    break;
  case comparisonCondition:
    AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)&a);
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0;
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    TVar2 = ((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_AstExpr).type;
    if (TVar2 < count) {
      if ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) == 0) {
        if (TVar2 == variable) {
          AstExpr::as<nigel::AstVariable>((AstExpr *)local_738);
          p_Var8 = &std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                    ::operator[](varList,(key_type *)
                                         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          (local_738._0_8_ + 0x30))->_M_use_count)->
                    super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2> *)&rOp,p_Var8);
          p_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8);
        }
        else {
          if (TVar2 != literal) goto LAB_0016bf4d;
          AstExpr::as<nigel::AstLiteral>((AstExpr *)local_688);
          IM_Constant::fromAstLiteral((shared_ptr<nigel::AstLiteral> *)local_738);
          std::__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2> *)&rOp,
                     (__shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2> *)local_738);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8));
          p_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_688 + 8);
        }
      }
      else {
        std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<nigel::AstReturning,void>
                  ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_698,
                   &((a.
                      super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->rVal).
                    super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::_Rb_tree(&local_c0,&varList->_M_t);
        parseAst(this,&local_698,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                  *)&local_c0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::~_Rb_tree(&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_698.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        TVar2 = ((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->lVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_AstExpr).type;
        if ((TVar2 < count) && ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) != 0)) {
          IM_SFR::getSFR(conditionPos.
                         super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                         _4_4_);
          psVar5 = &local_218;
          local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_738._0_8_;
          local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
          local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,push_adr,&local_218,&local_488);
          psVar6 = &local_488;
        }
        else {
          IM_SFR::getSFR(conditionPos.
                         super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                         _4_4_);
          psVar5 = &local_228;
          local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_738._0_8_;
          local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
          local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,mov_adr_a,&local_228,&local_498);
          psVar6 = &local_498;
        }
        p_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&(psVar6->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&(psVar5->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var9);
    }
LAB_0016bf4d:
    TVar2 = ((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_AstExpr).type;
    if (TVar2 < count) {
      if ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) == 0) {
        if (TVar2 == variable) {
          AstExpr::as<nigel::AstVariable>((AstExpr *)local_738);
          p_Var8 = &std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                    ::operator[](varList,(key_type *)
                                         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          (local_738._0_8_ + 0x30))->_M_use_count)->
                    super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>;
          unaff_EBP = t;
          std::__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                     p_Var8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8));
          switch(((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->rVal).
                   super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_AstExpr).type) {
          case variable:
            unaff_EBP = v;
            break;
          case literal:
            unaff_EBP = c;
          }
        }
        else if (TVar2 == literal) {
          AstExpr::as<nigel::AstLiteral>((AstExpr *)local_6a8);
          IM_Constant::fromAstLiteral((shared_ptr<nigel::AstLiteral> *)local_738);
          std::__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                     (__shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2> *)local_738);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6a8 + 8));
          unaff_EBP = 5;
          switch(((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->rVal).
                   super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_AstExpr).type) {
          case variable:
            unaff_EBP = count;
            break;
          case literal:
            unaff_EBP = 4;
          }
        }
      }
      else {
        std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<nigel::AstReturning,void>
                  ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_6b8,
                   &((a.
                      super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->lVal).
                    super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::_Rb_tree(&local_f0,&varList->_M_t);
        parseAst(this,&local_6b8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                  *)&local_f0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::~_Rb_tree(&local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        TVar2 = ((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->rVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_AstExpr).type;
        unaff_EBP = 6;
        if (TVar2 < count) {
          if ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) == 0) {
            if (TVar2 == literal) {
              unaff_EBP = 7;
            }
          }
          else {
            IM_SFR::getSFR(conditionPos.
                           super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                           _4_4_);
            local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_738._0_8_;
            local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
            local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,pop_adr,&local_238,&local_4a8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8));
            unaff_EBP = 8;
          }
        }
      }
    }
    switch((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->op) {
    case op_eql:
      local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_4b8,&local_4c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(local_348 + 0x10),
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)&conditionPos);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)local_348,
                 &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)local_358,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_AstCondition).super_AstExpr.token.
                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
      rOp_00.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358;
      rOp_00.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_348;
      token.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _4_4_;
      token.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _0_4_;
      token.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,
                        (shared_ptr<nigel::IM_Operator> *)(local_348 + 0x10),rOp_00,token);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_348 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_348 + 0x18));
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      p_Var9 = &local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_738._0_8_;
      local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_nz_rel,&local_248,&local_4d8);
      this_00 = &local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    case op_not_eql:
      local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_4e8,&local_4f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(local_378 + 0x10),
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)&conditionPos);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)local_378,
                 &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)local_388,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_AstCondition).super_AstExpr.token.
                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
      rOp_04.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388;
      rOp_04.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_378;
      token_03.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _4_4_;
      token_03.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _0_4_;
      token_03.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,
                        (shared_ptr<nigel::IM_Operator> *)(local_378 + 0x10),rOp_04,token_03);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_380);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_378 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_378 + 0x18));
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      p_Var9 = &local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_738._0_8_;
      local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_z_rel,&local_258,&local_508);
      this_00 = &local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    case op_less:
      local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_518,&local_528);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(local_3a8 + 0x10),
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)&conditionPos);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)local_3a8,
                 &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)local_3b8,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_AstCondition).super_AstExpr.token.
                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
      rOp_02.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8;
      rOp_02.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3a8;
      token_01.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _4_4_;
      token_01.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _0_4_;
      token_01.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,
                        (shared_ptr<nigel::IM_Operator> *)(local_3a8 + 0x10),rOp_02,token_01);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a8 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a8 + 0x18));
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      p_Var9 = &local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_738._0_8_;
      local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_nc_rel,&local_268,&local_538);
      this_00 = &local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    case op_more:
      local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_548,&local_558);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(local_3d8 + 0x10),
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)&conditionPos);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)local_3d8,
                 &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_AstCondition).super_AstExpr.token.
                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
      rOp_03.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8;
      rOp_03.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3d8;
      token_02.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _4_4_;
      token_02.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _0_4_;
      token_02.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,
                        (shared_ptr<nigel::IM_Operator> *)(local_3d8 + 0x10),rOp_03,token_02);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d8 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d8 + 0x18));
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_738._0_8_;
      local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_c_rel,&local_278,&local_568);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8));
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      p_Var9 = &local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_738._0_8_;
      local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_z_rel,&local_288,&local_578);
      this_00 = &local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    case op_less_eql:
      local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_588,&local_598);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(local_408 + 0x10),
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)&conditionPos);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)local_408,
                 &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)local_418,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_AstCondition).super_AstExpr.token.
                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
      rOp_01.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_418;
      rOp_01.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_408;
      token_00.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _4_4_;
      token_00.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _0_4_;
      token_00.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,
                        (shared_ptr<nigel::IM_Operator> *)(local_408 + 0x10),rOp_01,token_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 0x18));
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_738._0_8_;
      local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_c_rel,&local_298,&local_5a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8));
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      p_Var9 = &local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_738._0_8_;
      local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_nz_rel,&local_2a8,&local_5b8);
      this_00 = &local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    case op_more_eql:
      local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_5c8,&local_5d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(local_438 + 0x10),
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)&conditionPos);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)local_438,
                 &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)local_448,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_AstCondition).super_AstExpr.token.
                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
      rOp_05.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448;
      rOp_05.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_438;
      token_04.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _4_4_;
      token_04.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _0_4_;
      token_04.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,
                        (shared_ptr<nigel::IM_Operator> *)(local_438 + 0x10),rOp_05,token_04);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_440);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_438 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_438 + 0x18));
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      p_Var9 = &local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_738._0_8_;
      local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_c_rel,&local_2b8,&local_5e8);
      this_00 = &local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    default:
      goto switchD_0016c792_default;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var9);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8));
    break;
  case combinationCondition:
    AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)&a);
    iVar7 = IM_Condition::nextConditionPos;
    TVar3 = (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->op;
    if (TVar3 == op_not) {
      std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nigel::AstReturning,void>
                ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_708,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->rVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_1e0,&varList->_M_t);
      parseCondition(this,&local_708,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_1e0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_1e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_708.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      p_Var9 = &conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_rel,&local_318,&local_648);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0016cf4d;
    }
    if (TVar3 == op_or_log) {
      IM_Condition::nextConditionPos = IM_Condition::nextConditionPos + 1;
      std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nigel::AstReturning,void>
                ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_6e8,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->lVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_180,&varList->_M_t);
      parseCondition(this,&local_6e8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_180);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_180);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_rel,&local_2e8,&local_618);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,
                    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._0_4_);
      local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_rel,&local_2f8,&local_628);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      IM_Condition::getNew
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._4_4_,
                 conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._3_1_);
      local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,
                    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._0_4_);
      local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_abs,&local_308,&local_638);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nigel::AstReturning,void>
                ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_6f8,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->rVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_1b0,&varList->_M_t);
      parseCondition(this,&local_6f8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_1b0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_1b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_6f8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::make_shared<nigel::IM_Command>();
      *(undefined4 *)
       CONCAT44(conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,
                conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._0_4_) = 4;
      ((undefined4 *)
      CONCAT44(conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ._4_4_,conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._0_4_))[10] = iVar7;
      std::__cxx11::
      list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
      ::push_back(&this->base->imCommands,&conditionPos);
      goto LAB_0016cf48;
    }
    if (TVar3 == op_and_log) {
      IM_Condition::nextConditionPos = IM_Condition::nextConditionPos + 1;
      std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nigel::AstReturning,void>
                ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_6c8,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->lVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_120,&varList->_M_t);
      parseCondition(this,&local_6c8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_120);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_120);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      IM_Constant::fromConstant
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._7_1_);
      local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_rel,&local_2c8,&local_5f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      IM_Condition::getNew
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._4_4_,
                 conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._3_1_);
      local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,
                    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._0_4_);
      local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_abs,&local_2d8,&local_608);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nigel::AstReturning,void>
                ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&local_6d8,
                 &((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->rVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_150,&varList->_M_t);
      parseCondition(this,&local_6d8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_150);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_150);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::make_shared<nigel::IM_Command>();
      *(undefined4 *)
       CONCAT44(conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,
                conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._0_4_) = 4;
      ((undefined4 *)
      CONCAT44(conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ._4_4_,conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._0_4_))[10] = iVar7;
      std::__cxx11::
      list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
      ::push_back(&this->base->imCommands,&conditionPos);
      goto LAB_0016cf48;
    }
    goto LAB_0016cf52;
  }
switchD_0016c792_default:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0016cf48:
  p_Var9 = &conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
LAB_0016cf4d:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var9);
LAB_0016cf52:
  p_Var9 = &a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
LAB_0016cf57:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var9);
  return;
}

Assistant:

void IMC_Generator::parseCondition( std::shared_ptr<AstExpr> ast, std::map<String, std::shared_ptr<IM_Variable>> varList )
	{
		if( ast->type == AstExpr::Type::booleanParenthesis )
		{//Parenthesis block
			parseCondition( ast->as<AstBooleanParenthesis>()->content, varList );
		}
		else if( ast->type == AstExpr::Type::keywordCondition )
		{//Keyword (true/false)
			if( !ast->as<AstKeywordCondition>()->val )
			{//Is false
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );
			}
		}
		else if( ast->type == AstExpr::Type::arithmenticCondition )
		{//Arithmetic expression will be converted into boolean expression (0=false)
			auto ret = ast->as<AstArithmeticCondition>()->ret;
			OperationType ot;//Operator type combination
			std::shared_ptr<IM_Operator> op;

			//Memorize val
			if( ret->type == AstExpr::Type::variable )
			{
				ot = OT::v;
				op = varList[ret->as<AstVariable>()->name];
			}
			else if( ret->type == AstExpr::Type::literal )
			{
				ot = OT::c;
				op = IM_Constant::fromAstLiteral( ret->as<AstLiteral>() );
			}
			else if( ret->type == AstExpr::Type::term ||
					 ret->type == AstExpr::Type::unary ||
					 ret->type == AstExpr::Type::parenthesis ||
					 ret->type == AstExpr::Type::functionCall ||
					 ret->type == AstExpr::Type::refer ||
					 ret->type == AstExpr::Type::derefer )
			{
				ot = OT::t;
				parseAst( ret, varList );
			}

			generateMoveA( ot, op );
			addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
		}
		else if( ast->type == AstExpr::Type::comparisonCondition )
		{//Comparison of two returnables
			auto a = ast->as<AstComparisonCondition>();
			OC comb;//Operator type combination
			std::shared_ptr<IM_Operator> lOp;
			std::shared_ptr<IM_Operator> rOp;

			//Memorize rVal
			if( a->rVal->type == AstExpr::Type::variable ) rOp = varList[a->rVal->as<AstVariable>()->name];
			else if( a->rVal->type == AstExpr::Type::literal ) rOp = IM_Constant::fromAstLiteral( a->rVal->as<AstLiteral>() );
			else if( a->rVal->type == AstExpr::Type::term ||
					 a->rVal->type == AstExpr::Type::unary ||
					 a->rVal->type == AstExpr::Type::parenthesis ||
					 a->rVal->type == AstExpr::Type::functionCall ||
					 a->rVal->type == AstExpr::Type::refer ||
					 a->rVal->type == AstExpr::Type::derefer )
			{
				parseAst( a->rVal, varList );
				if( a->lVal->type == AstExpr::Type::term ||
					a->lVal->type == AstExpr::Type::unary ||
					a->lVal->type == AstExpr::Type::parenthesis ||
					a->lVal->type == AstExpr::Type::functionCall ||
					a->lVal->type == AstExpr::Type::refer ||
					a->lVal->type == AstExpr::Type::derefer )//push to stack if OC::tt
					addCmd( HexOp::push_adr, IM_SFR::getSFR( IM_SFR::SFR::A ) );
				else addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			//Check lValue and combination
			if( a->lVal->type == AstExpr::Type::variable )
			{//lValue is a variable
				lOp = varList[a->lVal->as<AstVariable>()->name];
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::vv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::vc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer ) comb = OC::vt;
			}
			else if( a->lVal->type == AstExpr::Type::literal )
			{//lValue is a constant
				lOp = IM_Constant::fromAstLiteral( a->lVal->as<AstLiteral>() );
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::cv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::cc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer ) comb = OC::ct;
			}
			else if( a->lVal->type == AstExpr::Type::term ||
					 a->lVal->type == AstExpr::Type::unary ||
					 a->lVal->type == AstExpr::Type::parenthesis ||
					 a->lVal->type == AstExpr::Type::functionCall ||
					 a->lVal->type == AstExpr::Type::refer ||
					 a->lVal->type == AstExpr::Type::derefer )
			{//lValue is a term
				parseAst( a->lVal, varList );
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::tv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::tc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer )
				{//pop from stack to B
					comb = OC::tt;
					addCmd( HexOp::pop_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				}
			}

			//Handle operation
			if( a->op == Token::Type::op_eql )
			{// ==
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_nz_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_not_eql )
			{// !=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_less )
			{// <
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_nc_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_more )
			{// >
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 4 ) );
				addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_less_eql )
			{// <=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 2 ) );//Is true -> ignore next
				addCmd( HexOp::jmp_nz_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_more_eql )
			{// >=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 2 ) );
			}

		}
		else if( ast->type == AstExpr::Type::combinationCondition )
		{//Combination of two conditionals
			auto a = ast->as<AstComparisonCondition>();

			if( a->op == Token::Type::op_and_log )
			{// &&
				u32 id = IM_Condition::getNextConditionPos();

				parseCondition( a->lVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 3 ) );//true
				addCmd( HexOp::jmp_abs, IM_Condition::getNew( id, false ) );//false
				parseCondition( a->rVal, varList );

				auto conditionPos = std::make_shared<IM_Command>();
				conditionPos->type = IM_Command::Type::conditionEnd;
				conditionPos->id = id;
				base->imCommands.push_back( conditionPos );
			}
			else if( a->op == Token::Type::op_or_log )
			{// ||
				u32 id = IM_Condition::getNextConditionPos();

				parseCondition( a->lVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );//true. Has to be a rel jmp because next command (2byte) will be false-jmp-destination.
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 3 ) );
				addCmd( HexOp::jmp_abs, IM_Condition::getNew( id, true ) );//true
				parseCondition( a->rVal, varList );

				auto conditionPos = std::make_shared<IM_Command>();
				conditionPos->type = IM_Command::Type::conditionEnd;
				conditionPos->id = id;
				base->imCommands.push_back( conditionPos );
			}
			else if( a->op == Token::Type::op_not )
			{// !
				parseCondition( a->rVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );
			}
		}
		else
		{//Unknown condition ast
			generateNotification( NT::err_expectConditionInParanthesis, ast->token );
		}
	}